

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::rpc_session::start(rpc_session *this,ptr<rpc_session> *self)

{
  bool is_ssl;
  type local_58;
  mutable_buffers_1 local_40;
  
  buffer::pos((this->header_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              0);
  is_ssl = this->ssl_enabled_;
  local_40.super_mutable_buffer.data_ =
       buffer::data((this->header_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  local_40.super_mutable_buffer.size_ = 0x36;
  local_58.this = this;
  std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58.self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>,
             &self->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>);
  aa::
  read<asio::mutable_buffers_1,nuraft::rpc_session::start(std::shared_ptr<nuraft::rpc_session>)::_lambda(std::error_code_const&,unsigned_long)_1_>
            (is_ssl,&this->ssl_socket_,&this->socket_,&local_40,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.self.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void start(ptr<rpc_session> self) {
        header_->pos(0);
        aa::read( ssl_enabled_, ssl_socket_, socket_,
                  asio::buffer( header_->data(), RPC_REQ_HEADER_SIZE ),
                  [this, self]
                  (const ERROR_CODE& err, size_t) -> void
        {
            if (err) {
                p_er( "session %" PRIu64 " failed to read rpc header from socket %s:%u "
                      "due to error %d, %s, ref count %ld",
                      session_id_,
                      cached_address_.c_str(),
                      cached_port_,
                      err.value(),
                      err.message().c_str(),
                      self.use_count() );
                this->stop();
                return;
            }

            // NOTE:
            //  due to async_read() above, header_ size will be always
            //  equal to or greater than RPC_REQ_HEADER_SIZE.
            header_->pos(0);
            byte* header_data = header_->data();
            uint32_t crc_local = crc32_8( header_data,
                                          RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN,
                                          0 );

            header_->pos(RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN);
            uint64_t flags_and_crc = header_->get_ulong();
            uint32_t crc_hdr = flags_and_crc & (uint32_t)0xffffffff;
            flags_ = (flags_and_crc >> 32);

            // Verify CRC.
            if (crc_local != crc_hdr) {
                p_er("CRC mismatch: local calculation %x, from header %x",
                     crc_local, crc_hdr);
                this->stop();
                return;
            }

            header_->pos(0);
            byte marker = header_->get_byte();
            if (marker == 0x1) {
                // Means that this is RPC_RESP, shouldn't happen.
                p_er("Wrong packet: expected REQ, got RESP");
                this->stop();
                return;
            }

            header_->pos(RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN - DATA_SIZE_LEN);
            int32 data_size = header_->get_int();
            // Up to 1GB.
            if (data_size < 0 || data_size > 0x40000000) {
                p_er("bad log data size in the header %d, stop "
                     "this session to protect further corruption",
                     data_size);
                this->stop();
                return;
            }

            if (data_size == 0) {
                // Don't carry data, immediately process request.
                this->read_complete(header_, nullptr);

            } else {
                // Carry some data, need to read further.
                ptr<buffer> log_ctx = buffer::alloc((size_t)data_size);
                aa::read( ssl_enabled_, ssl_socket_, socket_,
                          asio::buffer( log_ctx->data(),
                                        (size_t)data_size ),
                          std::bind( &rpc_session::read_log_data,
                                     self,
                                     log_ctx,
                                     std::placeholders::_1,
                                     std::placeholders::_2 ) );
            }
        } );
    }